

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

Privkey * cfd::core::Privkey::FromWif
                    (Privkey *__return_storage_ptr__,string *wif,NetType net_type,bool is_compressed
                    )

{
  uchar uVar1;
  int iVar2;
  value_type_conflict *__val;
  uchar *bytes_out;
  pointer pKVar3;
  CfdException *pCVar4;
  value_type_conflict *__val_1;
  vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *__x;
  int ret;
  size_t uncompressed;
  KeyFormatData format_data;
  size_t written;
  int local_f4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  ByteData local_d8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [104];
  undefined1 local_48 [32];
  
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x20;
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (net_type == kCustomChain) {
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bytes_out = (uchar *)operator_new(0x26);
    bytes_out[0x10] = '\0';
    bytes_out[0x11] = '\0';
    bytes_out[0x12] = '\0';
    bytes_out[0x13] = '\0';
    bytes_out[0x14] = '\0';
    bytes_out[0x15] = '\0';
    bytes_out[0x16] = '\0';
    bytes_out[0x17] = '\0';
    bytes_out[0x18] = '\0';
    bytes_out[0x19] = '\0';
    bytes_out[0x1a] = '\0';
    bytes_out[0x1b] = '\0';
    bytes_out[0x1c] = '\0';
    bytes_out[0x1d] = '\0';
    bytes_out[0x1e] = '\0';
    bytes_out[0x1f] = '\0';
    bytes_out[0] = '\0';
    bytes_out[1] = '\0';
    bytes_out[2] = '\0';
    bytes_out[3] = '\0';
    bytes_out[4] = '\0';
    bytes_out[5] = '\0';
    bytes_out[6] = '\0';
    bytes_out[7] = '\0';
    bytes_out[8] = '\0';
    bytes_out[9] = '\0';
    bytes_out[10] = '\0';
    bytes_out[0xb] = '\0';
    bytes_out[0xc] = '\0';
    bytes_out[0xd] = '\0';
    bytes_out[0xe] = '\0';
    bytes_out[0xf] = '\0';
    bytes_out[0x1e] = '\0';
    bytes_out[0x1f] = '\0';
    bytes_out[0x20] = '\0';
    bytes_out[0x21] = '\0';
    bytes_out[0x22] = '\0';
    bytes_out[0x23] = '\0';
    bytes_out[0x24] = '\0';
    bytes_out[0x25] = '\0';
    local_f4 = wally_base58_to_bytes
                         ((wif->_M_dataplus)._M_p,1,bytes_out,0x26,(size_t *)(local_b0 + 0x68));
    if (local_f4 != 0) {
      local_c0._0_8_ = "cfdcore_key.cpp";
      local_c0._8_4_ = 0x2c1;
      local_b0._0_8_ = (long)"CfdGetPrivkeyFromWif" + 0xd;
      logger::log<int&,std::__cxx11::string_const&>
                ((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,
                 "wally_base58_to_bytes error. ret={} wif={}.",&local_f4,wif);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c0._0_8_ = local_b0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"Error decode base58 WIF.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c0);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_f4 = wally_wif_is_uncompressed((wif->_M_dataplus)._M_p,(size_t *)&local_d8);
    if (local_f4 != 0) {
      local_c0._0_8_ = "cfdcore_key.cpp";
      local_c0._8_4_ = 0x2c9;
      local_b0._0_8_ = (long)"CfdGetPrivkeyFromWif" + 0xd;
      logger::log<int&,std::__cxx11::string_const&>
                ((CfdSourceLocation *)local_c0,kCfdLogLevelWarning,
                 "wally_wif_is_uncompressed error. ret={} wif={}.",&local_f4,wif);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c0._0_8_ = local_b0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"Error WIF is uncompressed.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c0);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    uVar1 = *bytes_out;
    memcpy(local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,bytes_out + 1,
           (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    __x = (vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
          &kDefaultKeyFormatList;
    if (g_custom_key_format_list != DAT_008a6338) {
      __x = (vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
            &g_custom_key_format_list;
    }
    ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::vector
              ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
               local_c0,__x);
    pKVar3 = (pointer)local_c0._0_8_;
    while( true ) {
      if (pKVar3 == (pointer)CONCAT44(local_c0._12_4_,local_c0._8_4_)) {
        ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                  ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                   local_c0);
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_c0._0_8_ = local_b0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c0,"Failed to parse WIF. unsupported WIF prefix.","");
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c0);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (pKVar3->wif_prefix_ == uVar1) break;
      pKVar3 = pKVar3 + 1;
    }
    net_type = pKVar3->is_mainnet ^ kTestnet;
    ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
              ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
               local_c0);
    is_compressed =
         local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == (pointer)0x0;
    operator_delete(bytes_out,0x26);
  }
  else {
    GetKeyFormatData((KeyFormatData *)local_c0,net_type == kLiquidV1 || net_type == kMainnet);
    iVar2 = wally_wif_to_bytes((wif->_M_dataplus)._M_p,(uint)local_b0[0x21],(uint)!is_compressed,
                               local_f0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,0x20);
    local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_d8.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,iVar2);
    if (iVar2 != 0) {
      local_48._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
           + 0x67;
      local_48._8_4_ = 0x2eb;
      local_48._16_8_ = "FromWif";
      logger::log<int&,std::__cxx11::string_const&>
                ((CfdSourceLocation *)(local_b0 + 0x68),kCfdLogLevelWarning,
                 "wally_wif_to_bytes error. ret={} wif={}.",(int *)&local_d8,wif);
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_48._0_8_ = (long)local_48 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_b0 + 0x68),"Error WIF to Private key.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)(local_b0 + 0x68));
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((_Bit_type *)local_b0._40_8_ != (_Bit_type *)0x0) {
      operator_delete((void *)local_b0._40_8_,local_b0._72_8_ - local_b0._40_8_);
      local_b0._40_8_ = (_Bit_type *)0x0;
      local_b0._48_4_ = 0;
      local_b0._56_8_ = (_Bit_type *)0x0;
      local_b0._64_4_ = 0;
      local_b0._72_8_ = (_Bit_pointer)0x0;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_c0);
  }
  if ((long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    iVar2 = wally_ec_private_key_verify
                      (local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)local_f0.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f0.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (iVar2 == 0) {
      ByteData::ByteData((ByteData *)local_c0,&local_f0);
      Privkey(__return_storage_ptr__,(ByteData *)local_c0,kMainnet,true);
      if ((pointer)local_c0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_c0._0_8_,local_b0._0_8_ - local_c0._0_8_);
      }
      __return_storage_ptr__->is_compressed_ = is_compressed;
      __return_storage_ptr__->net_type_ = net_type;
      if (local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
  }
  local_48._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
       + 0x67;
  local_48._8_4_ = 0x2f6;
  local_48._16_8_ = "FromWif";
  ByteData::ByteData(&local_d8,&local_f0);
  ByteData::GetHex_abi_cxx11_((string *)local_c0,&local_d8);
  logger::log<std::__cxx11::string&>
            ((CfdSourceLocation *)(local_b0 + 0x68),kCfdLogLevelWarning,
             "Invalid Privkey data. data={}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  if ((pointer)local_c0._0_8_ != (pointer)local_b0) {
    operator_delete((void *)local_c0._0_8_,(ulong)(local_b0._0_8_ + 1));
  }
  if (local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_c0._0_8_ = (pointer)local_b0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Invalid Privkey data","");
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c0);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Privkey Privkey::FromWif(
    const std::string &wif, NetType net_type, bool is_compressed) {
  std::vector<uint8_t> privkey(kPrivkeySize);
  NetType temp_net_type = net_type;
  bool is_temp_compressed = is_compressed;
  if (net_type == NetType::kCustomChain) {
    // auto analyze
    size_t written = 0;
    size_t uncompressed = 0;
    std::vector<uint8_t> buf(2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN);
    int ret = wally_base58_to_bytes(
        wif.data(), BASE58_FLAG_CHECKSUM, buf.data(), buf.size(), &written);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "wally_base58_to_bytes error. ret={} wif={}.", ret,
          wif);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Error decode base58 WIF.");
    }
    ret = wally_wif_is_uncompressed(wif.data(), &uncompressed);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "wally_wif_is_uncompressed error. ret={} wif={}.",
          ret, wif);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Error WIF is uncompressed.");
    }

    uint32_t prefix = buf[0];
    memcpy(privkey.data(), &buf[1], privkey.size());

    bool has_prefix = false;
    for (const auto &format : GetKeyFormatList()) {
      if (format.GetWifPrefix() == prefix) {
        temp_net_type = format.GetNetType();
        has_prefix = true;
        break;
      }
    }
    if (!has_prefix) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parse WIF. unsupported WIF prefix.");
    }
    is_temp_compressed = (uncompressed == 0) ? true : false;
  } else {
    auto format_data = GetKeyFormatData(net_type);
    uint32_t prefix = format_data.GetWifPrefix();
    uint32_t flags =
        (is_compressed ? WALLY_WIF_FLAG_COMPRESSED
                       : WALLY_WIF_FLAG_UNCOMPRESSED);

    int ret = wally_wif_to_bytes(
        wif.data(), prefix, flags, privkey.data(), kPrivkeySize);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "wally_wif_to_bytes error. ret={} wif={}.", ret,
          wif);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Error WIF to Private key.");
    }
    temp_net_type = net_type;
    is_temp_compressed = is_compressed;
  }

  if (!IsValid(privkey)) {
    warn(
        CFD_LOG_SOURCE, "Invalid Privkey data. data={}",
        ByteData(privkey).GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Privkey data");
  }
  Privkey key = Privkey(ByteData(privkey));
  key.SetPubkeyCompressed(is_temp_compressed);
  key.SetNetType(temp_net_type);
  return key;
}